

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w_wad.cpp
# Opt level: O0

int __thiscall FWadCollection::GetLastLump(FWadCollection *this,int wadnum)

{
  uint uVar1;
  DWORD DVar2;
  DWORD DVar3;
  FResourceFile **ppFVar4;
  int wadnum_local;
  FWadCollection *this_local;
  
  uVar1 = TArray<FResourceFile_*,_FResourceFile_*>::Size(&this->Files);
  if ((uint)wadnum < uVar1) {
    ppFVar4 = TArray<FResourceFile_*,_FResourceFile_*>::operator[](&this->Files,(long)wadnum);
    DVar2 = FResourceFile::GetFirstLump(*ppFVar4);
    ppFVar4 = TArray<FResourceFile_*,_FResourceFile_*>::operator[](&this->Files,(long)wadnum);
    DVar3 = FResourceFile::LumpCount(*ppFVar4);
    this_local._4_4_ = DVar2 + DVar3 + -1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int FWadCollection::GetLastLump (int wadnum) const
{
	if ((DWORD)wadnum >= Files.Size())
	{
		return 0;
	}

	return Files[wadnum]->GetFirstLump() + Files[wadnum]->LumpCount() - 1;
}